

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O1

token_type __thiscall
nlohmann::json_abi_v3_11_3::detail::
lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::scan_number(lexer<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>,_nlohmann::json_abi_v3_11_3::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *this)

{
  char __c;
  int iVar1;
  char_int_type cVar2;
  token_type tVar3;
  char *pcVar4;
  int *piVar5;
  ulonglong uVar6;
  longlong lVar7;
  int iVar8;
  double dVar9;
  char *endptr;
  char *local_20;
  
  reset(this);
  iVar1 = this->current;
  iVar8 = 5;
  if (iVar1 - 0x31U < 9) {
LAB_00400ce6:
    __c = (char)iVar1;
    while( true ) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&this->token_buffer,__c);
      cVar2 = get(this);
      if (9 < cVar2 - 0x30U) break;
      __c = (char)this->current;
    }
    if (cVar2 == 0x2e) {
LAB_00400e22:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&this->token_buffer,(char)this->decimal_point_char);
      cVar2 = get(this);
      if (9 < cVar2 - 0x30U) {
        pcVar4 = "invalid number; expected digit after \'.\'";
        goto LAB_00400e4c;
      }
      do {
        CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        push_back(&this->token_buffer,(char)this->current);
        cVar2 = get(this);
      } while (cVar2 - 0x30U < 10);
      if ((cVar2 == 0x65) || (cVar2 == 0x45)) goto LAB_00400d22;
      iVar8 = 7;
    }
    else if ((cVar2 == 0x45) || (cVar2 == 0x65)) {
LAB_00400d22:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&this->token_buffer,(char)this->current);
      cVar2 = get(this);
      if (9 < cVar2 - 0x30U) {
        if ((cVar2 == 0x2d) || (cVar2 == 0x2b)) {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(&this->token_buffer,(char)this->current);
          cVar2 = get(this);
          if (cVar2 - 0x30U < 10) goto LAB_00400da5;
          pcVar4 = "invalid number; expected digit after exponent sign";
        }
        else {
          pcVar4 = "invalid number; expected \'+\', \'-\', or digit after exponent";
        }
        goto LAB_00400e4c;
      }
LAB_00400da5:
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&this->token_buffer,(char)this->current);
      cVar2 = get(this);
      iVar8 = 7;
      if (cVar2 - 0x30U < 10) {
        do {
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          push_back(&this->token_buffer,(char)this->current);
          cVar2 = get(this);
        } while (cVar2 - 0x30U < 10);
      }
    }
LAB_00400e8d:
    unget(this);
    local_20 = (char *)0x0;
    piVar5 = __errno_location();
    *piVar5 = 0;
    if (iVar8 == 6) {
      lVar7 = strtoll((this->token_buffer)._M_dataplus._M_p,&local_20,10);
      if (*piVar5 == 0) {
        this->value_integer = lVar7;
        return value_integer;
      }
    }
    else if ((iVar8 == 5) &&
            (uVar6 = strtoull((this->token_buffer)._M_dataplus._M_p,&local_20,10), *piVar5 == 0)) {
      this->value_unsigned = uVar6;
      return value_unsigned;
    }
    dVar9 = strtod((this->token_buffer)._M_dataplus._M_p,&local_20);
    this->value_float = dVar9;
    tVar3 = value_float;
  }
  else {
    if (iVar1 == 0x30) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&this->token_buffer,'0');
      iVar8 = 5;
LAB_00400e02:
      cVar2 = get(this);
      if (cVar2 != 0x2e) {
        if ((cVar2 == 0x65) || (cVar2 == 0x45)) goto LAB_00400d22;
        goto LAB_00400e8d;
      }
      goto LAB_00400e22;
    }
    if (iVar1 == 0x2d) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&this->token_buffer,'-');
    }
    cVar2 = get(this);
    if (cVar2 - 0x31U < 9) {
      iVar1 = this->current;
      iVar8 = 6;
      goto LAB_00400ce6;
    }
    if (cVar2 == 0x30) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      push_back(&this->token_buffer,(char)this->current);
      iVar8 = 6;
      goto LAB_00400e02;
    }
    pcVar4 = "invalid number; expected digit after \'-\'";
LAB_00400e4c:
    this->error_message = pcVar4;
    tVar3 = parse_error;
  }
  return tVar3;
}

Assistant:

token_type scan_number()  // lgtm [cpp/use-of-goto]
    {
        // reset token_buffer to store the number's bytes
        reset();

        // the type of the parsed number; initially set to unsigned; will be
        // changed if minus sign, decimal point or exponent is read
        token_type number_type = token_type::value_unsigned;

        // state (init): we just found out we need to scan a number
        switch (current)
        {
            case '-':
            {
                add(current);
                goto scan_number_minus;
            }

            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            // all other characters are rejected outside scan_number()
            default:            // LCOV_EXCL_LINE
                JSON_ASSERT(false); // NOLINT(cert-dcl03-c,hicpp-static-assert,misc-static-assert) LCOV_EXCL_LINE
        }

scan_number_minus:
        // state: we just parsed a leading minus sign
        number_type = token_type::value_integer;
        switch (get())
        {
            case '0':
            {
                add(current);
                goto scan_number_zero;
            }

            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            default:
            {
                error_message = "invalid number; expected digit after '-'";
                return token_type::parse_error;
            }
        }

scan_number_zero:
        // state: we just parse a zero (maybe with a leading minus sign)
        switch (get())
        {
            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_any1:
        // state: we just parsed a number 0-9 (maybe with a leading minus sign)
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any1;
            }

            case '.':
            {
                add(decimal_point_char);
                goto scan_number_decimal1;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_decimal1:
        // state: we just parsed a decimal point
        number_type = token_type::value_float;
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            default:
            {
                error_message = "invalid number; expected digit after '.'";
                return token_type::parse_error;
            }
        }

scan_number_decimal2:
        // we just parsed at least one number after a decimal point
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_decimal2;
            }

            case 'e':
            case 'E':
            {
                add(current);
                goto scan_number_exponent;
            }

            default:
                goto scan_number_done;
        }

scan_number_exponent:
        // we just parsed an exponent
        number_type = token_type::value_float;
        switch (get())
        {
            case '+':
            case '-':
            {
                add(current);
                goto scan_number_sign;
            }

            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message =
                    "invalid number; expected '+', '-', or digit after exponent";
                return token_type::parse_error;
            }
        }

scan_number_sign:
        // we just parsed an exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
            {
                error_message = "invalid number; expected digit after exponent sign";
                return token_type::parse_error;
            }
        }

scan_number_any2:
        // we just parsed a number after the exponent or exponent sign
        switch (get())
        {
            case '0':
            case '1':
            case '2':
            case '3':
            case '4':
            case '5':
            case '6':
            case '7':
            case '8':
            case '9':
            {
                add(current);
                goto scan_number_any2;
            }

            default:
                goto scan_number_done;
        }

scan_number_done:
        // unget the character after the number (we only read it to know that
        // we are done scanning a number)
        unget();

        char* endptr = nullptr; // NOLINT(cppcoreguidelines-pro-type-vararg,hicpp-vararg)
        errno = 0;

        // try to parse integers first and fall back to floats
        if (number_type == token_type::value_unsigned)
        {
            const auto x = std::strtoull(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            JSON_ASSERT(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_unsigned = static_cast<number_unsigned_t>(x);
                if (value_unsigned == x)
                {
                    return token_type::value_unsigned;
                }
            }
        }
        else if (number_type == token_type::value_integer)
        {
            const auto x = std::strtoll(token_buffer.data(), &endptr, 10);

            // we checked the number format before
            JSON_ASSERT(endptr == token_buffer.data() + token_buffer.size());

            if (errno == 0)
            {
                value_integer = static_cast<number_integer_t>(x);
                if (value_integer == x)
                {
                    return token_type::value_integer;
                }
            }
        }

        // this code is reached if we parse a floating-point number or if an
        // integer conversion above failed
        strtof(value_float, token_buffer.data(), &endptr);

        // we checked the number format before
        JSON_ASSERT(endptr == token_buffer.data() + token_buffer.size());

        return token_type::value_float;
    }